

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

void __thiscall helics::NetworkCommsInterface::PortAllocator::PortAllocator(PortAllocator *this)

{
  _Rb_tree_header *p_Var1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  this->startingPort = -1;
  p_Var1 = &(this->usedPort)._M_t._M_impl.super__Rb_tree_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nextPorts)._M_t._M_impl.super__Rb_tree_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hosts)._M_t._M_impl.super__Rb_tree_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30._M_len = 9;
  local_30._M_str = "localhost";
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->hosts,&local_30);
  return;
}

Assistant:

NetworkCommsInterface::PortAllocator::PortAllocator()
{
    addNewHost(localHostString);
}